

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall directory::shrink(directory *this)

{
  uint uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t in_RCX;
  pointer puVar5;
  int iVar6;
  void *__buf;
  ulong uVar7;
  bool bVar8;
  bucket bucket;
  fstream bucketFile;
  
  uVar7 = 0;
  do {
    uVar1 = this->bucket_size;
    if (uVar1 <= uVar7) {
      uVar4 = this->depth - 1;
      bVar2 = (byte)uVar4 & 0x1f;
      this->depth = uVar4;
      puVar5 = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar6 = 0;
      if (0 < 1 << bVar2) {
        iVar6 = 1 << bVar2;
      }
      while( true ) {
        puVar5 = puVar5 + -1;
        bVar8 = iVar6 == 0;
        iVar6 = iVar6 + -1;
        if (bVar8) break;
        (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
      }
      this->bucket_size = uVar1 >> 1;
      return;
    }
    generateBucketFileName
              ((string *)&bucket,&this->typeName,
               (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7]);
    std::fstream::fstream(&bucketFile,(string *)&bucket,_S_out|_S_in|_S_bin);
    std::__cxx11::string::~string((string *)&bucket);
    bucket.size = '\0';
    bucket.depth = 1;
    bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    bucket.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    ::bucket::read(&bucket,(int)&bucketFile,__buf,in_RCX);
    uVar3 = ::bucket::getDepth(&bucket);
    uVar4 = this->depth;
    std::_Vector_base<index,_std::allocator<index>_>::~_Vector_base
              (&bucket.indices.super__Vector_base<index,_std::allocator<index>_>);
    std::fstream::~fstream(&bucketFile);
    uVar7 = uVar7 + 1;
  } while (uVar3 != uVar4);
  return;
}

Assistant:

void directory::shrink() {
    for (int i = 0; i < bucket_size; ++i) {
        fstream bucketFile(generateBucketFileName(typeName, bucket_ids[i]), INOUTBIN);

        bucket bucket;

        bucket.read(bucketFile);

        if(bucket.getDepth() == depth) {
            return;
        }
    }

    depth--;

    for (int j = 0; j < 1 << depth; ++j) {
        bucket_ids.pop_back();
    }

    bucket_size = bucket_size >> 1;
}